

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_elements_confidentialvalue.cpp
# Opt level: O2

void __thiscall
ConfidentialValue_ConvertFromConfidentialValue_Test::TestBody
          (ConfidentialValue_ConvertFromConfidentialValue_Test *this)

{
  bool bVar1;
  char *message;
  Amount AVar2;
  AssertHelper local_78;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_70;
  AssertionResult gtest_ar;
  ByteData value;
  Amount local_20;
  
  std::__cxx11::string::string((string *)&gtest_ar,"010000000005f5e100",(allocator *)&local_70);
  cfd::core::ByteData::ByteData(&value,(string *)&gtest_ar);
  std::__cxx11::string::~string((string *)&gtest_ar);
  AVar2 = cfd::core::ConfidentialValue::ConvertFromConfidentialValue(&value);
  local_20.amount_ = AVar2.amount_;
  local_20.ignore_check_ = AVar2.ignore_check_;
  local_70._M_impl.super__Vector_impl_data._M_start =
       (pointer)cfd::core::Amount::GetSatoshiValue(&local_20);
  local_78.data_._0_4_ = 100000000;
  testing::internal::CmpHelperEQ<long,int>
            ((internal *)&gtest_ar,"amount.GetSatoshiValue()","100000000",(long *)&local_70,
             (int *)&local_78);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_70);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_elements_confidentialvalue.cpp"
               ,0x99,message);
    testing::internal::AssertHelper::operator=(&local_78,(Message *)&local_70);
    testing::internal::AssertHelper::~AssertHelper(&local_78);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_70);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    std::__cxx11::string::string((string *)&gtest_ar,"001122",(allocator *)&local_78);
    cfd::core::ByteData::ByteData((ByteData *)&local_70,(string *)&gtest_ar);
    cfd::core::ConfidentialValue::ConvertFromConfidentialValue((ByteData *)&local_70);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_70);
    std::__cxx11::string::~string((string *)&gtest_ar);
  }
  testing::Message::Message((Message *)&gtest_ar);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)&local_70,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_elements_confidentialvalue.cpp"
             ,0x9d,
             "Expected: ConfidentialValue::ConvertFromConfidentialValue(ByteData(\"001122\")) throws an exception of type CfdException.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=((AssertHelper *)&local_70,(Message *)&gtest_ar);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_70);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&gtest_ar);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&value);
  return;
}

Assistant:

TEST(ConfidentialValue, ConvertFromConfidentialValue) {
  ByteData value("010000000005f5e100");
  Amount amount = ConfidentialValue::ConvertFromConfidentialValue(value);
  EXPECT_EQ(amount.GetSatoshiValue(), 100000000);

  EXPECT_THROW(
      ConfidentialValue::ConvertFromConfidentialValue(ByteData("001122")),
      CfdException);
}